

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  Vector VVar8;
  undefined1 auStack_1c8 [8];
  RayTracerTriangles tracer;
  vector<Triangle,_std::allocator<Triangle>_> local_a8;
  ulong local_90;
  undefined1 local_88 [32];
  float local_68;
  undefined8 local_64;
  uint8_t local_5c;
  Vector local_58;
  float local_4c;
  float local_44;
  float local_40;
  float local_3c;
  int local_38;
  allocator local_31;
  
  tracer.kdTree = (KdNode *)0x100000002;
  local_a8.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Using default config");
    std::endl<char,std::char_traits<char>>(poVar7);
    RayTracerConfig::defaultConfig();
    RayTracerConfig::operator=((RayTracerConfig *)&tracer.kdTree,(RayTracerConfig *)auStack_1c8);
    RayTracerConfig::~RayTracerConfig((RayTracerConfig *)auStack_1c8);
    tracer.super_RayTracerBase.config.super_BaseConfig.light.y = 0.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.light.z = 0.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.background.r = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.g = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.b = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig._51_1_ = 0;
    tracer.super_RayTracerBase.config._52_4_ = 0x3dcccccd;
    auStack_1c8._0_4_ = 0x451c4000;
    auStack_1c8._4_4_ = -0x3cb80000;
    tracer.super_RayTracerBase.config.super_BaseConfig.antiAliasing = -0x3bea0000;
    tracer.super_RayTracerBase.config.super_BaseConfig.maxRecursionLevel = 0x451c4000;
    tracer.super_RayTracerBase.config.super_BaseConfig.ambientCoefficient = 600.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.imageX = 0;
    tracer.super_RayTracerBase.config.super_BaseConfig.imageY = 0x451c4000;
    tracer.super_RayTracerBase.config.super_BaseConfig.imageZ = 0x43480000;
    tracer.super_RayTracerBase.config.super_BaseConfig.observer.x = 300.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.observer.y = -409600.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.observer.z = -131072.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.light.x._0_1_ = 0;
    VVar8 = getNormalVector((Triangle *)auStack_1c8);
    tracer.super_RayTracerBase.config.super_BaseConfig.light._4_8_ = VVar8._0_8_;
    tracer.super_RayTracerBase.config.super_BaseConfig._48_4_ = VVar8.z;
    std::vector<Triangle,_std::allocator<Triangle>_>::push_back(&local_a8,(value_type *)auStack_1c8)
    ;
    iVar2 = 0x14;
    while (iVar2 != 0) {
      local_38 = iVar2 + -1;
      iVar2 = rand();
      local_90 = (long)iVar2 % 5000 & 0xffffffff;
      local_40 = (float)((int)((long)iVar2 % 5000) + 1000);
      iVar2 = rand();
      local_44 = (float)(iVar2 % 3000 + -800);
      iVar3 = rand();
      local_3c = (float)(iVar3 % 5000 + -2000);
      iVar4 = rand();
      iVar5 = rand();
      iVar6 = rand();
      local_58.x = 0.0;
      local_58.y = 0.0;
      local_58.z = 0.0;
      local_64._0_1_ = '\0';
      local_64._1_1_ = '\0';
      local_64._2_1_ = '\0';
      local_64._3_1_ = '\0';
      local_64._4_1_ = '\0';
      local_64._5_1_ = '\0';
      local_64._6_1_ = '\0';
      local_64._7_1_ = '\0';
      local_5c = '\0';
      local_4c = 0.1;
      local_88._0_4_ = local_40;
      local_88._16_4_ = (undefined4)(iVar2 % 3000 + -0x316 + iVar5 % 400);
      local_88._20_4_ = (undefined4)(iVar3 % 5000 + -0x7c6 + iVar6 % 400);
      local_88._4_4_ = local_44;
      local_88._8_4_ = local_3c;
      local_88._12_4_ = local_40;
      local_88._24_4_ = (undefined4)((int)local_90 + 0x3f2 + iVar4 % 400);
      local_68 = local_3c;
      local_88._28_4_ = local_88._16_4_;
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      uVar1 = local_64;
      local_64._1_1_ = (uint8_t)((long)iVar3 % 200);
      local_64._0_1_ = (uint8_t)(iVar2 % 200);
      local_64._3_5_ = SUB85(uVar1,3);
      local_64._2_1_ = (uint8_t)(iVar4 % 200);
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      uVar1 = local_64;
      local_64._3_1_ = (uint8_t)((long)iVar2 % 200);
      local_64._4_1_ = (uint8_t)((long)iVar3 % 200);
      local_64._6_2_ = SUB82(uVar1,6);
      local_64._5_1_ = (uint8_t)((long)iVar4 % 200);
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      local_5c = (uint8_t)((long)iVar4 % 200);
      local_64._6_1_ = (uint8_t)(iVar2 % 200);
      local_64._7_1_ = (uint8_t)((long)iVar3 % 200);
      local_4c = 0.1;
      VVar8 = getNormalVector((Triangle *)local_88);
      local_58.z = VVar8.z;
      local_58._0_8_ = VVar8._0_8_;
      std::vector<Triangle,_std::allocator<Triangle>_>::push_back(&local_a8,(Triangle *)local_88);
      iVar2 = local_38;
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Reading config from file ");
    poVar7 = std::operator<<(poVar7,argv[1]);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::string((string *)local_88,argv[1],&local_31);
    RayTracerConfig::fromPlyFile((RayTracerConfig *)auStack_1c8,(string *)local_88);
    RayTracerConfig::operator=((RayTracerConfig *)&tracer.kdTree,(RayTracerConfig *)auStack_1c8);
    RayTracerConfig::~RayTracerConfig((RayTracerConfig *)auStack_1c8);
    std::__cxx11::string::~string((string *)local_88);
    tracer.kdTree = (KdNode *)0x100000002;
    RayTracerConfig::scaleTriangles((RayTracerConfig *)&tracer.kdTree);
  }
  RayTracerTriangles::RayTracerTriangles
            ((RayTracerTriangles *)auStack_1c8,(RayTracerConfig *)&tracer.kdTree);
  RayTracerTriangles::processPixels((RayTracerTriangles *)auStack_1c8);
  RayTracerBase::printBitmap((RayTracerBase *)auStack_1c8,(ostream *)&std::cout);
  RayTracerBase::~RayTracerBase((RayTracerBase *)auStack_1c8);
  RayTracerConfig::~RayTracerConfig((RayTracerConfig *)&tracer.kdTree);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  RayTracerConfig config;
  if (argc > 1)
  {
    std::cerr << "Reading config from file " << argv[1] << std::endl;
    config = RayTracerConfig::fromPlyFile(argv[1]);
    config.antiAliasing = 2;
    config.maxRecursionLevel = 1;
    config.ambientCoefficient = 0.1;
    config.imageX = 512;
    config.imageY = 768;
    //config.imageY = 500;
    config.imageZ = 1024;
    //config.imageZ = 500;
    config.observer = {0, 0, 0};
    config.light = {200, 1000, 200};
    config.scaleTriangles();
    config.background = {255, 255, 255};
  }
  else
  {
    std::cerr << "Using default config" << std::endl;
    config = RayTracerConfig::defaultConfig();

    Triangle tr;
    tr.x = {2500, -200, -600};
    tr.y = {2500, 600, 0};
    tr.z = {2500, 200, 300};
    tr.colorX = {0, 0, 200};
    tr.colorY = {200, 0, 0};
    tr.colorZ = {0, 200, 0};
    tr.reflectionCoefficient = 0.1;
    tr.normal = getNormalVector(tr);

    config.triangles.push_back(tr);


    for (int i = 0; i < 20; i++)
    {
      float x = rand() % 5000 + 1000.0;
      float y = rand() % 3000 - 800.0;
      float z = rand() % 5000 - 2000.0;

      float xx = rand() % 400 + 10.0;
      float yy = rand() % 400 + 10.0;
      float zz = rand() % 400 + 10.0;

      Triangle triangle;
      triangle.x = {x, y, z};
      triangle.y = {x, y + yy, z + zz};
      triangle.z = {x + xx, y + yy, z};

      triangle.colorX = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.colorY = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.colorZ = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.reflectionCoefficient = 0.1;
      triangle.normal = getNormalVector(triangle);

      config.triangles.push_back(triangle);
    }
  }
  // std::cerr << config;

  RayTracerTriangles tracer(config);
  tracer.processPixels();
  tracer.printBitmap(std::cout);
}